

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O0

void __thiscall SynthStateMonitor::allocatePartialsData(SynthStateMonitor *this)

{
  QGridLayout *pQVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  PartialState *pPVar5;
  Bit8u *pBVar6;
  PartialStateLEDWidget **ppPVar7;
  PartialStateLEDWidget *pPVar8;
  QWidget *pQVar9;
  uint uVar10;
  QFlags<Qt::AlignmentFlag> local_28 [4];
  uint local_18;
  uint local_14;
  uint i;
  uint partialColumnWidth;
  SynthStateMonitor *this_local;
  
  auVar2 = ZEXT416(this->partialCount) * ZEXT816(4);
  uVar4 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  _i = this;
  pPVar5 = (PartialState *)operator_new__(uVar4);
  this->partialStates = pPVar5;
  pBVar6 = (Bit8u *)operator_new__((ulong)this->partialCount);
  this->keysOfPlayingNotes = pBVar6;
  pBVar6 = (Bit8u *)operator_new__((ulong)this->partialCount);
  this->velocitiesOfPlayingNotes = pBVar6;
  auVar2 = ZEXT416(this->partialCount) * ZEXT816(8);
  uVar4 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppPVar7 = (PartialStateLEDWidget **)operator_new__(uVar4);
  this->partialStateLED = ppPVar7;
  local_14 = this->partialCount + 7 >> 3;
  for (local_18 = 0; local_18 < this->partialCount; local_18 = local_18 + 1) {
    pPVar8 = (PartialStateLEDWidget *)operator_new(0x30);
    pQVar1 = (this->ui->super_Ui_SynthWidget).partialStateGrid;
    pQVar9 = (QWidget *)(**(code **)(*(long *)(pQVar1 + 0x10) + 0x68))(pQVar1 + 0x10);
    PartialStateLEDWidget::PartialStateLEDWidget(pPVar8,pQVar9);
    this->partialStateLED[local_18] = pPVar8;
    QWidget::setFixedSize((int)this->partialStateLED[local_18],0x10);
    pQVar9 = (QWidget *)(this->ui->super_Ui_SynthWidget).partialStateGrid;
    pPVar8 = this->partialStateLED[local_18];
    uVar3 = local_18 / local_14;
    uVar10 = local_18 % local_14;
    QFlags<Qt::AlignmentFlag>::QFlags(local_28);
    QGridLayout::addWidget(pQVar9,(int)pPVar8,uVar3,(QFlags_conflict1 *)(ulong)uVar10);
  }
  return;
}

Assistant:

void SynthStateMonitor::allocatePartialsData() {
	partialStates = new PartialState[partialCount];
	keysOfPlayingNotes = new Bit8u[partialCount];
	velocitiesOfPlayingNotes = new Bit8u[partialCount];

	partialStateLED = new PartialStateLEDWidget*[partialCount];
	uint partialColumnWidth = (partialCount + 7) / 8;
	for (uint i = 0; i < partialCount; i++) {
		partialStateLED[i] = new PartialStateLEDWidget(ui->partialStateGrid->widget());
		partialStateLED[i]->setFixedSize(16, 16);
		ui->partialStateGrid->addWidget(partialStateLED[i], i / partialColumnWidth, i % partialColumnWidth);
	}
}